

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O3

int WebRtcVad_CalcVad48khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  int iVar1;
  int16_t *out;
  ulong uVar2;
  int16_t speech_nb [240];
  int32_t tmp_mem [736];
  int16_t local_d98 [240];
  int32_t local_bb8 [738];
  
  memset(local_bb8,0,0xb80);
  if (0x1df < frame_length) {
    uVar2 = frame_length / 0x1e0;
    out = local_d98;
    do {
      WebRtcSpl_Resample48khzTo8khz(speech_frame,out,&inst->state_48_to_8,local_bb8);
      out = out + 0x50;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  iVar1 = WebRtcVad_CalcVad8khz(inst,local_d98,frame_length / 6);
  return iVar1;
}

Assistant:

int WebRtcVad_CalcVad48khz(VadInstT* inst, const int16_t* speech_frame,
                           size_t frame_length) {
  int vad;
  size_t i;
  int16_t speech_nb[240];  // 30 ms in 8 kHz.
  // `tmp_mem` is a temporary memory used by resample function, length is
  // frame length in 10 ms (480 samples) + 256 extra.
  int32_t tmp_mem[480 + 256] = { 0 };
  const size_t kFrameLen10ms48khz = 480;
  const size_t kFrameLen10ms8khz = 80;
  size_t num_10ms_frames = frame_length / kFrameLen10ms48khz;

  for (i = 0; i < num_10ms_frames; i++) {
    WebRtcSpl_Resample48khzTo8khz(speech_frame,
                                  &speech_nb[i * kFrameLen10ms8khz],
                                  &inst->state_48_to_8,
                                  tmp_mem);
  }

  // Do VAD on an 8 kHz signal
  vad = WebRtcVad_CalcVad8khz(inst, speech_nb, frame_length / 6);

  return vad;
}